

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring_bitmap_rank(roaring_bitmap_t *bm,uint32_t x)

{
  uint uVar1;
  int iVar2;
  int local_30;
  uint32_t key;
  int i;
  uint32_t xhigh;
  uint64_t size;
  uint32_t x_local;
  roaring_bitmap_t *bm_local;
  
  _i = 0;
  local_30 = 0;
  while( true ) {
    if ((bm->high_low_container).size <= local_30) {
      return _i;
    }
    uVar1 = (uint)(bm->high_low_container).keys[local_30];
    if (x >> 0x10 <= uVar1) break;
    iVar2 = container_get_cardinality
                      ((bm->high_low_container).containers[local_30],
                       (bm->high_low_container).typecodes[local_30]);
    _i = _i + (long)iVar2;
    local_30 = local_30 + 1;
  }
  if (x >> 0x10 == uVar1) {
    iVar2 = container_rank((bm->high_low_container).containers[local_30],
                           (bm->high_low_container).typecodes[local_30],(uint16_t)x);
    return _i + (long)iVar2;
  }
  return _i;
}

Assistant:

uint64_t roaring_bitmap_rank(const roaring_bitmap_t *bm, uint32_t x) {
    uint64_t size = 0;
    uint32_t xhigh = x >> 16;
    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            return size + container_rank(bm->high_low_container.containers[i],
                                         bm->high_low_container.typecodes[i],
                                         x & 0xFFFF);
        } else {
            return size;
        }
    }
    return size;
}